

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::call(cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  sequence<0,_1,_2> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*(long *)(in_RDX + 8) - *(long *)in_RDX == 0x18) {
    cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
    ::_call<0,1,2>((cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                    *)&local_80,args,in_RDX);
    if (local_80._M_dataplus._M_p != (pointer)0x0) {
      *(long *)(local_80._M_dataplus._M_p + 8) = *(long *)(local_80._M_dataplus._M_p + 8) + 1;
    }
    *(pointer *)&(this->mFunc).super__Function_base._M_functor = local_80._M_dataplus._M_p;
    any::recycle((any *)&local_80);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_a0,3);
  std::operator+(&local_40,"Wrong size of the arguments. Expected ",&local_a0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_c0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_c0._M_dataplus._M_p == psVar2) {
    local_c0.field_2._M_allocated_capacity = *psVar2;
    local_c0.field_2._8_8_ = plVar1[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar2;
  }
  local_c0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_60,*(long *)(in_RDX + 8) - *(long *)in_RDX >> 3);
  std::operator+(&local_80,&local_c0,&local_60);
  cs::runtime_error::runtime_error(this_00,&local_80);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}